

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O2

void __thiscall adios2::ADIOS::FlushAll(ADIOS *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"in call to ADIOS::FlushAll",&local_31);
  CheckPointer(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  adios2::core::ADIOS::FlushAll();
  return;
}

Assistant:

void ADIOS::FlushAll()
{
    CheckPointer("in call to ADIOS::FlushAll");
    m_ADIOS->FlushAll();
}